

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeMemAllocSharedPrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,
          ze_device_mem_alloc_desc_t *device_desc,ze_host_mem_alloc_desc_t *host_desc,size_t size,
          size_t alignment,ze_device_handle_t hDevice,void **pptr)

{
  ze_result_t zVar1;
  
  if (hContext == (ze_context_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (((pptr != (void **)0x0 &&
          (host_desc != (ze_host_mem_alloc_desc_t *)0x0 &&
          device_desc != (ze_device_mem_alloc_desc_t *)0x0)) &&
        (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, device_desc->flags < 8)) &&
       (host_desc->flags < 0x10)) {
      if (size == 0) {
        zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_SIZE;
      }
      else {
        zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT;
        if ((alignment & alignment - 1) == 0) {
          zVar1 = ParameterValidation::validateExtensions<_ze_device_mem_alloc_desc_t_const*>
                            (device_desc);
          if (zVar1 == ZE_RESULT_SUCCESS) {
            zVar1 = ParameterValidation::validateExtensions<_ze_host_mem_alloc_desc_t_const*>
                              (host_desc);
            return zVar1;
          }
        }
      }
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeMemAllocSharedPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_device_mem_alloc_desc_t* device_desc,  ///< [in] pointer to device memory allocation descriptor
        const ze_host_mem_alloc_desc_t* host_desc,      ///< [in] pointer to host memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        ze_device_handle_t hDevice,                     ///< [in][optional] device handle to associate with
        void** pptr                                     ///< [out] pointer to shared allocation
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == device_desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == host_desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x7 < device_desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0xf < host_desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0 == size )
            return ZE_RESULT_ERROR_UNSUPPORTED_SIZE;

        if( 0 != (alignment & (alignment - 1)) )
            return ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT;

        auto retVal = ZE_RESULT_SUCCESS;
        retVal = ParameterValidation::validateExtensions(device_desc);
        if(retVal)
            return retVal;
        retVal = ParameterValidation::validateExtensions(host_desc);
        return retVal;
    }